

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cppcms::json::value::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,value *this,char *path,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def)

{
  char cVar1;
  value *v;
  
  v = (value *)cppcms::json::value::find((char *)this);
  cVar1 = cppcms::json::value::is_undefined();
  if (cVar1 == '\0') {
    traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
              (__return_storage_ptr__,v);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)def);
  }
  return __return_storage_ptr__;
}

Assistant:

T get(char const *path,T const &def) const
		{
			value const &v=find(path);
			if(v.is_undefined())
				return def;
			try {
				return v.get_value<T>();
			}
			catch(std::bad_cast const &e) {
				return def;
			}
		}